

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitvector.h
# Opt level: O2

const_iterator * __thiscall
dg::ADT::
SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
::begin(const_iterator *__return_storage_ptr__,
       SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
       *this)

{
  const_iterator::const_iterator(__return_storage_ptr__,&this->_bits,false);
  return __return_storage_ptr__;
}

Assistant:

const_iterator begin() const { return const_iterator(_bits); }